

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall AggressiveBotStrategy::attackFromCountryIndex(AggressiveBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  Country *pCVar4;
  pointer ppCVar5;
  int iVar6;
  Country *pCVar7;
  Country *pCVar8;
  ulong uVar9;
  long lVar10;
  pointer ppCVar11;
  ulong uVar12;
  pointer ppCVar13;
  
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar3 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar7 = (Country *)0x0;
  for (ppCVar11 = ppCVar2; ppCVar11 != ppCVar3; ppCVar11 = ppCVar11 + 1) {
    pCVar4 = *ppCVar11;
    pCVar8 = pCVar4;
    if ((pCVar7 != (Country *)0x0) &&
       (pCVar8 = pCVar7, *pCVar7->pNumberOfTroops < *pCVar4->pNumberOfTroops)) {
      ppCVar13 = (pCVar4->pAdjCountries->
                 super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar5 = (pCVar4->pAdjCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar13 != ppCVar5) {
        do {
          if (*(*ppCVar13)->pPlayerOwnerId != *pCVar4->pPlayerOwnerId) {
            pCVar7 = pCVar4;
          }
          ppCVar13 = ppCVar13 + 1;
          pCVar8 = pCVar7;
        } while (ppCVar13 != ppCVar5);
      }
    }
    pCVar7 = pCVar8;
  }
  (this->super_PlayerStrategy).from = pCVar7;
  lVar10 = (long)ppCVar3 - (long)ppCVar2;
  if (lVar10 == 0) {
    iVar6 = -1;
  }
  else {
    lVar10 = lVar10 >> 3;
    uVar9 = 0xffffffff;
    uVar12 = 0;
    do {
      if (*ppCVar2[uVar12]->cyID == *pCVar7->cyID) {
        uVar9 = uVar12 & 0xffffffff;
      }
      iVar6 = (int)uVar9;
      uVar12 = uVar12 + 1;
    } while (lVar10 + (ulong)(lVar10 == 0) != uVar12);
  }
  return iVar6;
}

Assistant:

int AggressiveBotStrategy::attackFromCountryIndex() {
    unsigned int fromCountryIndex = -1;
    Map::Country* biggestCountry = nullptr;
    for (auto* country : *player->getOwnedCountries()) {
        if (biggestCountry == nullptr) {
            biggestCountry = country;
        } else if (biggestCountry->getNumberOfTroops() < country->getNumberOfTroops()) {
            for (auto* neighbour : *country->getAdjCountries()) {
                if (neighbour->getPlayerOwnerID() != country->getPlayerOwnerID()) {
                    biggestCountry = country;
                }
            }
        }
    }

    from = biggestCountry;
    for (unsigned long i = 0; i < player->getOwnedCountries()->size(); i++) {
        if (player->getOwnedCountries()->at(i)->getCountryId() == biggestCountry->getCountryId()) {
            fromCountryIndex = i;
        }
    }

    return (int) fromCountryIndex;
}